

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcOpeningElement::IfcOpeningElement(IfcOpeningElement *this)

{
  IfcOpeningElement *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcFeatureElementSubtraction).field_0x168,"IfcOpeningElement");
  IfcFeatureElementSubtraction::IfcFeatureElementSubtraction
            (&this->super_IfcFeatureElementSubtraction,&PTR_construction_vtable_24__00e8da48);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOpeningElement,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcOpeningElement,_0UL> *)
             &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.field_0x158,
             &PTR_construction_vtable_24__00e8dbd0);
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0xe8d8f0;
  *(undefined8 *)&(this->super_IfcFeatureElementSubtraction).field_0x168 = 0xe8da30;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0xe8d918;
  (this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xe8d940;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0xe8d968;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0xe8d990;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.field_0x138
       = 0xe8d9b8;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.field_0x148
       = 0xe8d9e0;
  *(undefined8 *)&(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.field_0x158 =
       0xe8da08;
  return;
}

Assistant:

IfcOpeningElement() : Object("IfcOpeningElement") {}